

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_loadhostpairs(SessionHandle *data)

{
  curl_slist *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  Curl_addrinfo *addr;
  void *pvVar6;
  Curl_dns_entry *pCVar7;
  char *fmt;
  curl_slist **ppcVar8;
  int port;
  curl_slist **local_240;
  char address [256];
  char hostname [256];
  
  ppcVar8 = &(data->change).resolve;
  local_240 = ppcVar8;
  do {
    pcVar1 = *ppcVar8;
    if (pcVar1 == (curl_slist *)0x0) {
      *local_240 = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar4 = pcVar1->data;
    if (pcVar4 != (char *)0x0) {
      if (*pcVar4 == '-') {
        iVar3 = __isoc99_sscanf(pcVar4 + 1,"%255[^:]:%d",hostname,&port);
        if (iVar3 == 2) {
          pcVar4 = create_hostcache_id(hostname,port);
          if (pcVar4 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar5 = strlen(pcVar4);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar4,sVar5 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar4);
        }
        else {
          pcVar4 = pcVar1->data;
          fmt = "Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n";
LAB_00443268:
          Curl_infof(data,fmt,pcVar4);
        }
      }
      else {
        iVar3 = __isoc99_sscanf(pcVar4,"%255[^:]:%d:%255s",hostname,&port,address);
        if (iVar3 != 3) {
          pcVar4 = pcVar1->data;
          fmt = "Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n";
          goto LAB_00443268;
        }
        addr = Curl_str2addr(address,port);
        if (addr == (Curl_addrinfo *)0x0) {
          Curl_infof(data,"Address in \'%s\' found illegal!\n",pcVar1->data);
        }
        else {
          pcVar4 = create_hostcache_id(hostname,port);
          if (pcVar4 == (char *)0x0) {
LAB_0044330e:
            Curl_freeaddrinfo(addr);
            return CURLE_OUT_OF_MEMORY;
          }
          sVar5 = strlen(pcVar4);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pvVar6 = Curl_hash_pick((data->dns).hostcache,pcVar4,sVar5 + 1);
          (*Curl_cfree)(pcVar4);
          if (pvVar6 == (void *)0x0) {
            pCVar7 = Curl_cache_addr(data,addr,hostname,port);
            if (pCVar7 == (Curl_dns_entry *)0x0) {
              bVar2 = true;
            }
            else {
              pCVar7->timestamp = 0;
              pCVar7->inuse = pCVar7->inuse + -1;
              bVar2 = false;
            }
          }
          else {
            Curl_freeaddrinfo(addr);
            bVar2 = false;
          }
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          if (bVar2) goto LAB_0044330e;
          Curl_infof(data,"Added %s:%d:%s to DNS cache\n",hostname,(ulong)(uint)port,address);
        }
      }
    }
    ppcVar8 = &pcVar1->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct SessionHandle *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  char address[256];
  int port;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next ) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len+1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *addr;
      char *entry_id;
      size_t entry_len;

      if(3 != sscanf(hostp->data, "%255[^:]:%d:%255s", hostname, &port,
                     address)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        continue;
      }

      addr = Curl_str2addr(address, port);
      if(!addr) {
        infof(data, "Address in '%s' found illegal!\n", hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns) {
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, addr, hostname, port);
        if(dns) {
          dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
          /* release the returned reference; the cache itself will keep the
           * entry alive: */
          dns->inuse--;
        }
      }
      else
        /* this is a duplicate, free it again */
        Curl_freeaddrinfo(addr);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, address);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}